

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::ArrowTableFunction::ArrowToDuckDB
               (ArrowScanLocalState *scan_state,arrow_column_map_t *arrow_convert_data,
               DataChunk *output,idx_t start,bool arrow_scan_is_projected,idx_t rowid_column_index)

{
  ArrowArray *array;
  long lVar1;
  idx_t size;
  DataChunk *pDVar2;
  ArrowArrayPhysicalType AVar3;
  reference pvVar4;
  value_type vVar5;
  ArrowArrayWrapper *pAVar6;
  ArrowArrayWrapper *pAVar7;
  mapped_type *this;
  type type;
  ArrowArrayScanState *array_state;
  reference pvVar8;
  InvalidInputException *pIVar9;
  ulong uVar10;
  ulong uVar11;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *this_00;
  undefined7 in_register_00000081;
  ulong uVar12;
  ulong __n;
  uint64_t in_stack_ffffffffffffff40;
  allocator local_a1;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *local_a0;
  ulong local_98;
  ArrowScanLocalState *local_90;
  idx_t local_88;
  type local_80;
  DataChunk *local_78;
  unsigned_long col_idx;
  undefined4 local_64;
  vector<unsigned_long,_true> *local_60;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  string local_50;
  
  local_64 = (undefined4)CONCAT71(in_register_00000081,arrow_scan_is_projected);
  local_60 = &scan_state->column_ids;
  uVar12 = 0xffffffffffffffff;
  this_00 = &scan_state->chunk;
  __n = 0;
  local_98 = 0xffffffffffffffff;
  local_a0 = this_00;
  local_90 = scan_state;
  local_88 = rowid_column_index;
  local_78 = output;
  local_58 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)arrow_convert_data;
  do {
    if ((ulong)(((long)(local_78->data).
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(local_78->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                      .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= __n) {
      return;
    }
    vVar5 = __n;
    if ((scan_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (scan_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar4 = vector<unsigned_long,_true>::get<true>(local_60,__n);
      vVar5 = *pvVar4;
    }
    uVar10 = vVar5;
    if ((char)local_64 != '\0') {
      uVar10 = __n;
    }
    col_idx = vVar5;
    if (uVar12 == rowid_column_index) {
      uVar11 = uVar10;
      if (vVar5 != rowid_column_index) goto LAB_018a4f02;
    }
    else {
      uVar11 = rowid_column_index;
      if ((vVar5 != uVar12) && (uVar11 = uVar10, rowid_column_index <= vVar5)) {
        col_idx = vVar5 + 1;
        uVar11 = uVar10 + 1;
      }
LAB_018a4f02:
      pAVar6 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this_00);
      pAVar7 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this_00);
      array = (pAVar7->arrow_array).children[uVar11];
      if (array->release == (_func_void_ArrowArray_ptr *)0x0) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"arrow_scan: released array passed",&local_a1);
        InvalidInputException::InvalidInputException(pIVar9,&local_50);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lVar1 = array->length;
      pAVar7 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this_00);
      if (lVar1 != (pAVar7->arrow_array).length) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"arrow_scan: array length mismatch",&local_a1);
        InvalidInputException::InvalidInputException(pIVar9,&local_50);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(local_58,&col_idx);
      type = shared_ptr<duckdb::ArrowType,_true>::operator*(this);
      array_state = ArrowScanLocalState::GetState(scan_state,col_idx);
      if ((array_state->owned_data).internal.
          super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&array_state->owned_data,local_a0);
      }
      local_80 = type;
      AVar3 = anon_unknown_2::GetArrowArrayPhysicalType(type);
      pDVar2 = local_78;
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&local_78->data,__n);
      rowid_column_index = local_88;
      scan_state = local_90;
      uVar12 = local_98;
      size = pDVar2->count;
      if (AVar3 == DEFAULT) {
        SetValidityMask(pvVar8,array,local_90,size,(pAVar6->arrow_array).offset,-1,false);
        pDVar2 = local_78;
        pvVar8 = vector<duckdb::Vector,_true>::get<true>(&local_78->data,__n);
        in_stack_ffffffffffffff40 = 0;
        ColumnArrowToDuckDB(pvVar8,array,array_state,pDVar2->count,local_80,-1,(ValidityMask *)0x0,0
                            ,false);
        this_00 = local_a0;
        uVar12 = local_98;
        rowid_column_index = local_88;
      }
      else if (AVar3 == RUN_END_ENCODED) {
        ColumnArrowToDuckDBRunEndEncoded
                  (pvVar8,array,array_state,size,local_80,-1,(ValidityMask *)0x0,
                   in_stack_ffffffffffffff40);
        this_00 = local_a0;
        uVar12 = local_98;
        scan_state = local_90;
        rowid_column_index = local_88;
      }
      else {
        in_stack_ffffffffffffff40 = 0;
        ColumnArrowToDuckDBDictionary
                  (pvVar8,array,array_state,size,local_80,-1,(ValidityMask *)0x0,0);
        this_00 = local_a0;
        scan_state = local_90;
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void ArrowTableFunction::ArrowToDuckDB(ArrowScanLocalState &scan_state, const arrow_column_map_t &arrow_convert_data,
                                       DataChunk &output, idx_t start, bool arrow_scan_is_projected,
                                       idx_t rowid_column_index) {
	for (idx_t idx = 0; idx < output.ColumnCount(); idx++) {
		auto col_idx = scan_state.column_ids.empty() ? idx : scan_state.column_ids[idx];

		// If projection was not pushed down into the arrow scanner, but projection pushdown is enabled on the
		// table function, we need to use original column ids here.
		auto arrow_array_idx = arrow_scan_is_projected ? idx : col_idx;

		if (rowid_column_index != COLUMN_IDENTIFIER_ROW_ID) {
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				arrow_array_idx = rowid_column_index;
			} else if (col_idx >= rowid_column_index) {
				// Since the rowid column is skipped when the table is bound (its not a named column),
				// we need to shift references forward in the Arrow array by one to match the alignment
				// that DuckDB believes the Arrow array is in.
				col_idx += 1;
				arrow_array_idx += 1;
			}
		} else {
			// If there isn't any defined row_id_index, and we're asked for it, skip the column.
			// This is the incumbent behavior.
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				continue;
			}
		}

		auto &parent_array = scan_state.chunk->arrow_array;
		auto &array = *scan_state.chunk->arrow_array.children[arrow_array_idx];
		if (!array.release) {
			throw InvalidInputException("arrow_scan: released array passed");
		}
		if (array.length != scan_state.chunk->arrow_array.length) {
			throw InvalidInputException("arrow_scan: array length mismatch");
		}

		D_ASSERT(arrow_convert_data.find(col_idx) != arrow_convert_data.end());
		auto &arrow_type = *arrow_convert_data.at(col_idx);
		auto &array_state = scan_state.GetState(col_idx);

		// Make sure this Vector keeps the Arrow chunk alive in case we can zero-copy the data
		if (!array_state.owned_data) {
			array_state.owned_data = scan_state.chunk;
		}

		auto array_physical_type = GetArrowArrayPhysicalType(arrow_type);

		switch (array_physical_type) {
		case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
			ColumnArrowToDuckDBDictionary(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::RUN_END_ENCODED:
			ColumnArrowToDuckDBRunEndEncoded(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::DEFAULT:
			SetValidityMask(output.data[idx], array, scan_state, output.size(), parent_array.offset, -1);
			ColumnArrowToDuckDB(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		default:
			throw NotImplementedException("ArrowArrayPhysicalType not recognized");
		}
	}
}